

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_data_into_fd.c
# Opt level: O1

int pad_to(archive *a,int fd,int can_lseek,size_t nulls_size,char *nulls,int64_t target_offset,
          int64_t actual_offset)

{
  char *pcVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t __n;
  int iVar4;
  
  if (can_lseek == 0) {
    iVar4 = 0;
    if (target_offset < (long)nulls) {
      do {
        __n = (long)nulls - target_offset;
        if (target_offset + 0x4000 <= (long)nulls) {
          __n = 0x4000;
        }
        sVar2 = write(fd,(void *)nulls_size,__n);
        if (sVar2 < 0) {
          pcVar1 = "Write error";
          goto LAB_00229f70;
        }
        target_offset = target_offset + sVar2;
      } while (target_offset < (long)nulls);
    }
  }
  else {
    pcVar1 = (char *)lseek(fd,(long)nulls - target_offset,1);
    iVar4 = 0;
    if (pcVar1 != nulls) {
      pcVar1 = "Seek error";
LAB_00229f70:
      piVar3 = __errno_location();
      archive_set_error(a,*piVar3,pcVar1);
      iVar4 = -0x1e;
    }
  }
  return iVar4;
}

Assistant:

static int
pad_to(struct archive *a, int fd, int can_lseek,
    size_t nulls_size, const char *nulls,
    int64_t target_offset, int64_t actual_offset)
{
	size_t to_write;
	ssize_t bytes_written;

	if (can_lseek) {
		actual_offset = lseek(fd,
		    target_offset - actual_offset, SEEK_CUR);
		if (actual_offset != target_offset) {
			archive_set_error(a, errno, "Seek error");
			return (ARCHIVE_FATAL);
		}
		return (ARCHIVE_OK);
	}
	while (target_offset > actual_offset) {
		to_write = nulls_size;
		if (target_offset < actual_offset + (int64_t)nulls_size)
			to_write = (size_t)(target_offset - actual_offset);
		bytes_written = write(fd, nulls, to_write);
		if (bytes_written < 0) {
			archive_set_error(a, errno, "Write error");
			return (ARCHIVE_FATAL);
		}
		actual_offset += bytes_written;
	}
	return (ARCHIVE_OK);
}